

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

void __thiscall QMakeEvaluator::traceMsgInternal(QMakeEvaluator *this,char *fmt,...)

{
  ProFile *pPVar1;
  char16_t *pcVar2;
  FILE *__stream;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  QArrayData *pQVar3;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  QArrayData *local_60;
  undefined8 *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  __stream = _stderr;
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Da;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  pPVar1 = (this->m_current).pro;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (pPVar1 == (ProFile *)0x0) {
    traceMsgInternal();
  }
  else {
    if ((this->m_current).line == 0) {
      pQVar3 = &((pPVar1->m_fileName).d.d)->super_QArrayData;
      pcVar2 = (pPVar1->m_fileName).d.ptr;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQVar3->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQVar3->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::toLocal8Bit_helper((QChar *)&local_60,(longlong)pcVar2);
      if (local_58 == (undefined8 *)0x0) {
        local_58 = &QByteArray::_empty;
      }
      fprintf(__stream,"DEBUG 1: %s: ",local_58);
    }
    else {
      pQVar3 = &((pPVar1->m_fileName).d.d)->super_QArrayData;
      pcVar2 = (pPVar1->m_fileName).d.ptr;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQVar3->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQVar3->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::toLocal8Bit_helper((QChar *)&local_60,(longlong)pcVar2);
      if (local_58 == (undefined8 *)0x0) {
        local_58 = &QByteArray::_empty;
      }
      fprintf(__stream,"DEBUG 1: %s:%d: ",local_58,(ulong)(this->m_current).line);
    }
    if (local_60 != (QArrayData *)0x0) {
      LOCK();
      (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60,1,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  puStack_40 = &stack0x00000008;
  local_48 = (undefined1 *)0x3000000010;
  local_38 = auStack_118;
  __vfprintf_chk(_stderr,1,fmt);
  fputc(10,_stderr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::traceMsgInternal(const char *fmt, ...) const
{
    va_list ap;

    if (!m_current.pro)
        fprintf(stderr, "DEBUG 1: ");
    else if (m_current.line <= 0)
        fprintf(stderr, "DEBUG 1: %s: ", qPrintable(m_current.pro->fileName()));
    else
        fprintf(stderr, "DEBUG 1: %s:%d: ", qPrintable(m_current.pro->fileName()), m_current.line);
    va_start(ap, fmt);
    vfprintf(stderr, fmt, ap);
    va_end(ap);
    fputc('\n', stderr);
}